

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdKelvinTexShaderOp::emulate_mthd(MthdKelvinTexShaderOp *this)

{
  pgraph_state *state;
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  pgraph_kelvin_check_err18(state);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  iVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
          chipset.chipset;
  uVar3 = 0xfff00018;
  if (0x24 < iVar1 && iVar1 != 0x2a) {
    uVar3 = 0xfff00000;
  }
  uVar2 = 0xfffe7;
  if (0x24 < iVar1 && iVar1 != 0x2a) {
    uVar2 = 0xfffff;
  }
  uVar3 = uVar2 & (this->super_SingleMthdTest).super_MthdTest.val |
          uVar3 & (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  bundle_tex_shader_op;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_shader_op = uVar3;
  pgraph_bundle(state,0x20,0,uVar3,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			if (!nv04_pgraph_is_nv25p(&chipset)) {
				insrt(exp.bundle_tex_shader_op, 0, 3, extr(val, 0, 3));
				insrt(exp.bundle_tex_shader_op, 5, 15, extr(val, 5, 15));
			} else {
				insrt(exp.bundle_tex_shader_op, 0, 20, val);
			}
			pgraph_bundle(&exp, BUNDLE_TEX_SHADER_OP, 0, exp.bundle_tex_shader_op, true);
		}
	}